

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O2

shared_ptr<mir::inst::Value> __thiscall
front::irGenerator::irGenerator::rightValueToValue(irGenerator *this,RightVal *rightValue)

{
  LabelId LVar1;
  Value *pVVar2;
  variant_alternative_t<0UL,_variant<int,_int,_basic_string<char>_>_> *pvVar3;
  variant_alternative_t<2UL,_variant<int,_int,_basic_string<char>_>_> *pvVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<mir::inst::Value> sVar5;
  __shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2> _Stack_58;
  string local_48;
  
  (this->_package).super_Displayable._vptr_Displayable = (_func_int **)0x0;
  *(undefined8 *)&(this->_package).functions._M_t._M_impl = 0;
  if (*(__index_type *)&in_RDX._M_pi[2]._vptr__Sp_counted_base == '\x02') {
    pVVar2 = (Value *)operator_new(0x20);
    pvVar4 = std::get<2ul,int,int,std::__cxx11::string>
                       ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_RDX._M_pi);
    std::__cxx11::string::string((string *)&local_48,(string *)pvVar4);
    LVar1 = nameToLabelId((irGenerator *)rightValue,&local_48);
    *(undefined ***)&pVVar2->field_0x8 = &PTR_display_001d90d0;
    *(LabelId *)&pVVar2->field_0x10 = LVar1;
    pVVar2->field_0x18 = 1;
    (pVVar2->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001dafa8;
    pVVar2->shift = Lsl;
    pVVar2->shift_amount = '\0';
    std::__shared_ptr<mir::inst::Value,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mir::inst::Value,void>
              ((__shared_ptr<mir::inst::Value,(__gnu_cxx::_Lock_policy)2> *)&_Stack_58,pVVar2);
    std::__shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2> *)this,&_Stack_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_58._M_refcount);
    std::__cxx11::string::~string((string *)&local_48);
    in_RDX._M_pi = extraout_RDX_00;
  }
  else if (*(__index_type *)&in_RDX._M_pi[2]._vptr__Sp_counted_base == '\0') {
    pVVar2 = (Value *)operator_new(0x20);
    pvVar3 = std::get<0ul,int,int,std::__cxx11::string>
                       ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_RDX._M_pi);
    *(variant_alternative_t<0UL,_variant<int,_int,_basic_string<char>_>_> *)&pVVar2->field_0x8 =
         *pvVar3;
    pVVar2->field_0x18 = 0;
    (pVVar2->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001dafa8;
    pVVar2->shift = Lsl;
    pVVar2->shift_amount = '\0';
    std::__shared_ptr<mir::inst::Value,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mir::inst::Value,void>
              ((__shared_ptr<mir::inst::Value,(__gnu_cxx::_Lock_policy)2> *)&_Stack_58,pVVar2);
    std::__shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2> *)this,&_Stack_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_58._M_refcount);
    in_RDX._M_pi = extraout_RDX;
  }
  sVar5.super___shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar5.super___shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mir::inst::Value>)
         sVar5.super___shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Value> irGenerator::rightValueToValue(RightVal &rightValue) {
  shared_ptr<Value> value;

  switch (rightValue.index()) {
    case 0:
      value = shared_ptr<Value>(new Value(get<0>(rightValue)));
      break;
    case 2: {
      value = shared_ptr<Value>(
          new Value(VarId(nameToLabelId(get<2>(rightValue)))));
    } break;
    default:
      break;
  }

  return value;
}